

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::transcode_uastc_to_etc1
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t i;
  int iVar4;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 aVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint8_t *puVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  uint uVar20;
  bool bVar21;
  color32 block_colors [2];
  color32 block_colors_1 [4];
  anon_union_4_3_898e29d3_for_color32_0 local_80;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  decoder_etc_block *local_78;
  ulong local_70;
  int local_68 [4];
  color32 local_58 [6];
  uint8_t *local_40;
  long local_38;
  
  if (unpacked_src_blk->m_mode != 8) {
    bVar21 = unpacked_src_blk->m_etc1_flip;
    bVar1 = unpacked_src_blk->m_etc1_diff;
    local_70 = (ulong)bVar1;
    *(byte *)((long)pDst + 3) =
         (byte)(unpacked_src_blk->m_etc1_inten1 << 2) |
         (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | bVar21 + bVar1 * '\x02';
    uVar11 = (uint)bVar1 << 4 | 0xf;
    lVar10 = (ulong)bVar21 * 0x20 + 0x1eb2f1;
    lVar6 = 0;
    local_78 = (decoder_etc_block *)pDst;
    do {
      lVar12 = 0;
      iVar4 = 0;
      iVar7 = 0;
      iVar8 = 0;
      do {
        bVar3 = *(byte *)(lVar10 + lVar12 * 2);
        bVar2 = *(byte *)(lVar10 + -1 + lVar12 * 2);
        iVar8 = iVar8 + (uint)block_pixels[bVar3][bVar2].field_0.field_0.r;
        iVar7 = iVar7 + (uint)block_pixels[bVar3][bVar2].field_0.field_0.g;
        iVar4 = iVar4 + (uint)block_pixels[bVar3][bVar2].field_0.field_0.b;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      local_80.c[lVar6 * 4] = (uint8_t)((iVar8 * uVar11 + 0x3fc) / 0x7f8);
      local_80.c[lVar6 * 4 + 1] = (uint8_t)((iVar7 * uVar11 + 0x3fc) / 0x7f8);
      local_80.c[lVar6 * 4 + 2] = (uint8_t)((iVar4 * uVar11 + 0x3fc) / 0x7f8);
      local_80.c[lVar6 * 4 + 3] = '\0';
      if ((0x1d00UL >> ((ulong)unpacked_src_blk->m_mode & 0x3f) & 1) == 0) {
        aVar5 = (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                apply_etc1_bias((color32 *)&(&local_80)[lVar6].field_0,unpacked_src_blk->m_etc1_bias
                                ,uVar11,(uint32_t)lVar6);
        (&local_80)[lVar6].field_0 = aVar5;
      }
      lVar10 = lVar10 + 0x10;
      bVar21 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar21);
    if ((char)local_70 == '\0') {
      (local_78->field_0).m_bytes[0] = local_80.field_0.r << 4 | local_7c;
      (local_78->field_0).m_bytes[1] = local_80.field_0.g << 4 | local_7b;
      bVar3 = local_80.field_0.b << 4 | local_7a;
    }
    else {
      iVar7 = (uint)local_7c - (uint)local_80.field_0.r;
      iVar13 = (uint)local_7b - (uint)local_80.field_0.g;
      iVar8 = (uint)local_7a - (uint)local_80.field_0.b;
      iVar4 = 3;
      if (iVar7 < 3) {
        iVar4 = iVar7;
      }
      if (iVar4 < -3) {
        iVar4 = -4;
      }
      iVar9 = 3;
      if (iVar13 < 3) {
        iVar9 = iVar13;
      }
      if (iVar9 < -3) {
        iVar9 = -4;
      }
      iVar15 = 3;
      if (iVar8 < 3) {
        iVar15 = iVar8;
      }
      if (iVar15 < -3) {
        iVar15 = -4;
      }
      (local_78->field_0).m_bytes[0] =
           local_80.field_0.r << 3 | (char)iVar4 + (char)(iVar7 >> 0x1f) * -8;
      (local_78->field_0).m_bytes[1] =
           local_80.field_0.g << 3 | (char)iVar9 + (char)(iVar13 >> 0x1f) * -8;
      bVar3 = local_80.field_0.b << 3 | (char)iVar15 + (char)(iVar8 >> 0x1f) * -8;
    }
    (local_78->field_0).m_bytes[2] = bVar3;
    puVar19 = &(*block_pixels)[0].field_0.field_0.b;
    lVar6 = 0;
    uVar20 = 0;
    uVar11 = 0;
    lVar10 = 0;
    puVar14 = puVar19;
    do {
      puVar18 = puVar14;
      lVar12 = lVar10;
      local_70 = lVar6;
      decoder_etc_block::get_block_colors(local_78,local_58,(uint32_t)lVar6);
      lVar6 = 0;
      do {
        local_68[lVar6] =
             (uint)local_58[lVar6].field_0.field_0.b * 0x13 +
             (uint)local_58[lVar6].field_0.field_0.g * 0xb7 +
             (uint)local_58[lVar6].field_0.field_0.r * 0x36;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      if (((local_78->field_0).m_bytes[3] & 1) == 0) {
        iVar4 = (int)local_70 * 8;
        puVar14 = puVar19;
        lVar6 = 0;
        do {
          lVar10 = 0;
          iVar7 = iVar4;
          do {
            uVar17 = (uint)puVar14[lVar10] * 0x26 + (uint)puVar14[lVar10 + -1] * 0x16e +
                     (uint)puVar14[lVar10 + -2] * 0x6c;
            uVar20 = uVar20 | ("\x01"[(ulong)(uVar17 < (uint)(local_68[1] + local_68[2])) +
                                      (ulong)(uVar17 < (uint)(local_68[0] + local_68[1])) +
                                      (ulong)(uVar17 < (uint)(local_68[2] + local_68[3]))] & 1) <<
                              ((byte)iVar7 & 0x1f);
            uVar11 = uVar11 | (uint)("\x01"[(ulong)(uVar17 < (uint)(local_68[1] + local_68[2])) +
                                            (ulong)(uVar17 < (uint)(local_68[0] + local_68[1])) +
                                            (ulong)(uVar17 < (uint)(local_68[2] + local_68[3]))] >>
                                    1) << ((byte)iVar7 & 0x1f);
            iVar7 = iVar7 + 1;
            lVar10 = lVar10 + 0x10;
          } while (lVar10 != 0x40);
          iVar4 = iVar4 + 4;
          puVar14 = puVar14 + 4;
          bVar21 = lVar6 == 0;
          lVar6 = lVar6 + 1;
        } while (bVar21);
      }
      else {
        lVar6 = lVar12;
        puVar14 = puVar18;
        lVar10 = 0;
        do {
          lVar16 = 0;
          do {
            bVar3 = (char)lVar6 + (char)lVar16;
            uVar17 = (uint)puVar14[lVar16] * 0x26 + (uint)puVar14[lVar16 + -1] * 0x16e +
                     (uint)puVar14[lVar16 + -2] * 0x6c;
            uVar20 = uVar20 | ("\x01"[(ulong)(uVar17 < (uint)(local_68[1] + local_68[2])) +
                                      (ulong)(uVar17 < (uint)(local_68[0] + local_68[1])) +
                                      (ulong)(uVar17 < (uint)(local_68[2] + local_68[3]))] & 1) <<
                              (bVar3 & 0x1f);
            uVar11 = uVar11 | (uint)("\x01"[(ulong)(uVar17 < (uint)(local_68[1] + local_68[2])) +
                                            (ulong)(uVar17 < (uint)(local_68[0] + local_68[1])) +
                                            (ulong)(uVar17 < (uint)(local_68[2] + local_68[3]))] >>
                                    1) << (bVar3 & 0x1f);
            lVar16 = lVar16 + 4;
          } while (lVar16 != 0x10);
          puVar14 = puVar14 + 0x10;
          lVar6 = lVar6 + 1;
          bVar21 = lVar10 == 0;
          lVar10 = lVar10 + 1;
        } while (bVar21);
      }
      lVar6 = local_70 + 1;
      puVar19 = puVar19 + 8;
      lVar10 = lVar12 + 2;
      puVar14 = puVar18 + 0x20;
      local_40 = puVar18;
      local_38 = lVar12;
    } while (local_70 == 0);
    *(ushort *)((long)&local_78->field_0 + 6) = (ushort)uVar20 << 8 | (ushort)uVar20 >> 8;
    (local_78->field_0).m_bytes[5] = (uint8_t)uVar11;
    (local_78->field_0).m_bytes[4] = (uint8_t)(uVar11 >> 8);
    return;
  }
  *(byte *)((long)pDst + 3) =
       (byte)(unpacked_src_blk->m_etc1_inten0 << 2) |
       (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | unpacked_src_blk->m_etc1_diff * '\x02';
  bVar3 = (byte)unpacked_src_blk->m_etc1_r;
  if (unpacked_src_blk->m_etc1_diff == true) {
    *(byte *)pDst = bVar3 << 3;
    *(char *)((long)pDst + 1) = (char)unpacked_src_blk->m_etc1_g << 3;
    bVar3 = (char)unpacked_src_blk->m_etc1_b << 3;
  }
  else {
    *(byte *)pDst = (byte)(unpacked_src_blk->m_etc1_r << 4) | bVar3;
    *(byte *)((long)pDst + 1) =
         (byte)(unpacked_src_blk->m_etc1_g << 4) | (byte)unpacked_src_blk->m_etc1_g;
    bVar3 = (byte)(unpacked_src_blk->m_etc1_b << 4) | (byte)unpacked_src_blk->m_etc1_b;
  }
  *(byte *)((long)pDst + 2) = bVar3;
  *(undefined4 *)((long)pDst + 4) =
       *(undefined4 *)(s_etc1_solid_selectors + (ulong)unpacked_src_blk->m_etc1_selector * 4);
  return;
}

Assistant:

void transcode_uastc_to_etc1(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		decoder_etc_block& dst_blk = *static_cast<decoder_etc_block*>(pDst);

		if (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			dst_blk.m_bytes[3] = (uint8_t)((unpacked_src_blk.m_etc1_diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten0 << 2));

			if (unpacked_src_blk.m_etc1_diff)
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r << 3);
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g << 3);
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b << 3);
			}
			else
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r | (unpacked_src_blk.m_etc1_r << 4));
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g | (unpacked_src_blk.m_etc1_g << 4));
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b | (unpacked_src_blk.m_etc1_b << 4));
			}

			memcpy(dst_blk.m_bytes + 4, &s_etc1_solid_selectors[unpacked_src_blk.m_etc1_selector][0], 4);

			return;
		}

		const bool flip = unpacked_src_blk.m_etc1_flip != 0;
		const bool diff = unpacked_src_blk.m_etc1_diff != 0;

		dst_blk.m_bytes[3] = (uint8_t)((int)flip | (diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten1 << 2));

		const uint32_t limit = diff ? 31 : 15;

		color32 block_colors[2];

		for (uint32_t subset = 0; subset < 2; subset++)
		{
			uint32_t avg_color[3];
			memset(avg_color, 0, sizeof(avg_color));

			for (uint32_t j = 0; j < 8; j++)
			{
				const etc_coord2& c = g_etc1_pixel_coords[flip][subset][j];

				avg_color[0] += block_pixels[c.m_y][c.m_x].r;
				avg_color[1] += block_pixels[c.m_y][c.m_x].g;
				avg_color[2] += block_pixels[c.m_y][c.m_x].b;
			} // j

			block_colors[subset][0] = (uint8_t)((avg_color[0] * limit + 1020) / (8 * 255));
			block_colors[subset][1] = (uint8_t)((avg_color[1] * limit + 1020) / (8 * 255));
			block_colors[subset][2] = (uint8_t)((avg_color[2] * limit + 1020) / (8 * 255));
			block_colors[subset][3] = 0;

			if (g_uastc_mode_has_etc1_bias[unpacked_src_blk.m_mode])
			{
				block_colors[subset] = apply_etc1_bias(block_colors[subset], unpacked_src_blk.m_etc1_bias, limit, subset);
			}

		} // subset

		if (diff)
		{
			int dr = block_colors[1].r - block_colors[0].r;
			int dg = block_colors[1].g - block_colors[0].g;
			int db = block_colors[1].b - block_colors[0].b;

			dr = basisu::clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = basisu::clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = basisu::clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);

			if (dr < 0) dr += 8;
			if (dg < 0) dg += 8;
			if (db < 0) db += 8;

			dst_blk.m_bytes[0] = (uint8_t)((block_colors[0].r << 3) | dr);
			dst_blk.m_bytes[1] = (uint8_t)((block_colors[0].g << 3) | dg);
			dst_blk.m_bytes[2] = (uint8_t)((block_colors[0].b << 3) | db);
		}
		else
		{
			dst_blk.m_bytes[0] = (uint8_t)(block_colors[1].r | (block_colors[0].r << 4));
			dst_blk.m_bytes[1] = (uint8_t)(block_colors[1].g | (block_colors[0].g << 4));
			dst_blk.m_bytes[2] = (uint8_t)(block_colors[1].b | (block_colors[0].b << 4));
		}

		etc1_determine_selectors(dst_blk, &block_pixels[0][0], 0, 2);
	}